

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O2

Result * CoreML::validateRecurrentActivationParams
                   (Result *__return_storage_ptr__,ActivationParams *params)

{
  char *pcVar1;
  string local_1c0;
  stringstream ss;
  ostream local_190 [376];
  
  if (((ulong)params->_oneof_case_[0] < 0x2a) &&
     ((0x300c0000420U >> ((ulong)params->_oneof_case_[0] & 0x3f) & 1) != 0)) {
    Result::Result(__return_storage_ptr__);
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::operator<<(local_190,"Recurrent non-linearity type ");
    pcVar1 = MLActivationParamsNonlinearityType_Name(params->_oneof_case_[0]);
    std::operator<<(local_190,pcVar1);
    std::operator<<(local_190," is not supported in this version of CoreML.");
    std::__cxx11::stringbuf::str();
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Result validateRecurrentActivationParams(const Specification::ActivationParams& params) {
    // make sure params fall into expected values for recurrent activations
    switch (params.NonlinearityType_case()) {
        case Specification::ActivationParams::NonlinearityTypeCase::kLinear:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kSigmoid:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kTanh:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kScaledTanh:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kSigmoidHard:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kReLU:
            break;
        default:
        {
            std::stringstream ss;
            ss << "Recurrent non-linearity type ";
            ss << MLActivationParamsNonlinearityType_Name(static_cast<MLActivationParamsNonlinearityType>(params.NonlinearityType_case()));
            ss << " is not supported in this version of CoreML.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, ss.str());
        }
    }
    return Result();
}